

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# robin_hash.h
# Opt level: O2

void __thiscall
tsl::detail_robin_hash::
bucket_entry<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_unsigned_int>,_true>
::swap_with_value_in_bucket
          (bucket_entry<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_unsigned_int>,_true>
           *this,distance_type *dist_from_ideal_bucket,truncated_hash_type *hash,value_type *value)

{
  distance_type dVar1;
  truncated_hash_type tVar2;
  
  std::
  pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_unsigned_int>
  ::swap(value,(pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_unsigned_int>
                *)&(this->m_value).__align);
  dVar1 = *dist_from_ideal_bucket;
  *dist_from_ideal_bucket = this->m_dist_from_ideal_bucket;
  this->m_dist_from_ideal_bucket = dVar1;
  tVar2 = (this->super_bucket_entry_hash<true>).m_hash;
  (this->super_bucket_entry_hash<true>).m_hash = *hash;
  *hash = tVar2;
  return;
}

Assistant:

void swap_with_value_in_bucket(distance_type& dist_from_ideal_bucket, 
                                   truncated_hash_type& hash, value_type& value) 
    {
        tsl_assert(!empty());
        
        using std::swap;
        swap(value, this->value());
        swap(dist_from_ideal_bucket, m_dist_from_ideal_bucket);
        
        // Avoid warning of unused variable if StoreHash is false
        (void) hash;
        if(StoreHash) {
            const truncated_hash_type tmp_hash = this->truncated_hash();
            this->set_hash(hash);
            hash = tmp_hash;
        }
    }